

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_file_handle_parse_cmp_func
               (fdb_file_handle *fhandle,size_t n_func,char **kvs_names,
               fdb_custom_cmp_variable *functions,void **user_params)

{
  char *__s;
  list *plVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *__dest;
  size_t sVar4;
  
  if (functions != (fdb_custom_cmp_variable *)0x0 && (kvs_names != (char **)0x0 && n_func != 0)) {
    plVar1 = (list *)calloc(1,0x10);
    fhandle->cmp_func_list = plVar1;
    for (sVar4 = 0; n_func != sVar4; sVar4 = sVar4 + 1) {
      puVar2 = (undefined8 *)calloc(1,0x28);
      __s = kvs_names[sVar4];
      if (__s == (char *)0x0) {
        *puVar2 = 0;
      }
      else {
        sVar3 = strlen(__s);
        __dest = (char *)calloc(1,sVar3 + 1);
        *puVar2 = __dest;
        strcpy(__dest,__s);
      }
      puVar2[1] = functions[sVar4];
      if (user_params != (void **)0x0) {
        puVar2[2] = user_params[sVar4];
      }
      list_push_back(fhandle->cmp_func_list,(list_elem *)(puVar2 + 3));
    }
  }
  return;
}

Assistant:

void fdb_file_handle_parse_cmp_func(fdb_file_handle *fhandle,
                                    size_t n_func,
                                    char **kvs_names,
                                    fdb_custom_cmp_variable *functions,
                                    void **user_params)
{
    uint64_t i;
    struct cmp_func_node *node;

    if (n_func == 0 || !kvs_names || !functions) {
        return;
    }

    fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(fhandle->cmp_func_list);

    for (i=0;i<n_func;++i){
        node = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        if (kvs_names[i]) {
            node->kvs_name = (char*)calloc(1, strlen(kvs_names[i])+1);
            strcpy(node->kvs_name, kvs_names[i]);
        } else {
            // NULL .. default KVS
            node->kvs_name = NULL;
        }
        node->func = functions[i];
        if (user_params) {
            node->user_param = user_params[i];
        }
        list_push_back(fhandle->cmp_func_list, &node->le);
    }
}